

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

String * __thiscall
Json::OurReader::normalizeEOL_abi_cxx11_
          (String *__return_storage_ptr__,OurReader *this,Location begin,Location end)

{
  OurReader *pOVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (OurReader *)begin) {
    do {
      pOVar1 = (OurReader *)
               ((long)&(this->nodes_).c.
                       super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                       super__Deque_impl_data._M_map + 1);
      if (*(char *)&(this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map == '\r') {
        if ((pOVar1 != (OurReader *)begin) &&
           (*(char *)((long)&(this->nodes_).c.
                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                             _M_impl.super__Deque_impl_data._M_map + 1) == '\n')) {
          pOVar1 = (OurReader *)
                   ((long)&(this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_map + 2);
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      this = pOVar1;
    } while (pOVar1 != (OurReader *)begin);
  }
  return __return_storage_ptr__;
}

Assistant:

String OurReader::normalizeEOL(OurReader::Location begin,
                               OurReader::Location end) {
  String normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  OurReader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
        // convert dos EOL
        ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}